

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

QStandardItem * __thiscall QStandardItem::takeChild(QStandardItem *this,int row,int column)

{
  bool bVar1;
  int row_00;
  QStandardItemModelPrivate *this_00;
  const_reference ppQVar2;
  long in_FS_OFFSET;
  int savedCols;
  int savedRows;
  QStandardItemModelPrivate *model_d;
  QStandardItemPrivate *item_d;
  int index;
  QStandardItem *item;
  QStandardItemPrivate *d;
  QVector<QStandardItem_*> savedChildren;
  QModelIndex changedIdx;
  QList<QStandardItem_*> *in_stack_ffffffffffffff18;
  QModelIndex *in_stack_ffffffffffffff20;
  QModelIndex *pQVar3;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QStandardItemModelPrivate *in_stack_ffffffffffffff30;
  QStandardItemModelPrivate *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  QStandardItem *parent;
  undefined1 local_98 [24];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QStandardItemModelPrivate *)d_func((QStandardItem *)0x8d1763);
  parent = (QStandardItem *)0x0;
  row_00 = QStandardItemPrivate::childIndex
                     ((QStandardItemPrivate *)in_stack_ffffffffffffff38,
                      (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30
                     );
  if (row_00 != -1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x8d17cc);
    ppQVar2 = QList<QStandardItem_*>::at
                        ((QList<QStandardItem_*> *)in_stack_ffffffffffffff20,
                         (qsizetype)in_stack_ffffffffffffff18);
    parent = *ppQVar2;
    if (parent != (QStandardItem *)0x0) {
      in_stack_ffffffffffffff38 = (QStandardItemModelPrivate *)d_func((QStandardItem *)0x8d17fd);
      if (*(long *)this_00 != 0) {
        in_stack_ffffffffffffff30 = QStandardItemModel::d_func((QStandardItemModel *)0x8d181e);
        in_stack_ffffffffffffff2c = *(int *)&in_stack_ffffffffffffff38->field_0x40;
        in_stack_ffffffffffffff28 = *(int *)&in_stack_ffffffffffffff38->field_0x44;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QStandardItem_*>::QList
                  ((QList<QStandardItem_*> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        if (0 < in_stack_ffffffffffffff2c) {
          QStandardItemModelPrivate::rowsAboutToBeRemoved
                    (in_stack_ffffffffffffff38,(QStandardItem *)in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
          *(undefined4 *)&in_stack_ffffffffffffff38->field_0x40 = 0;
          memset(local_50,0,0x18);
          QList<QStandardItem_*>::QList((QList<QStandardItem_*> *)0x8d18ca);
          QList<QStandardItem_*>::operator=
                    ((QList<QStandardItem_*> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          QList<QStandardItem_*>::~QList((QList<QStandardItem_*> *)0x8d18ed);
          QStandardItemModelPrivate::rowsRemoved(this_00,parent,row_00,in_stack_ffffffffffffff40);
        }
        if (0 < in_stack_ffffffffffffff28) {
          QStandardItemModelPrivate::columnsAboutToBeRemoved
                    (in_stack_ffffffffffffff38,(QStandardItem *)in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
          *(int *)&in_stack_ffffffffffffff38->field_0x44 = 0;
          memset(local_68,0,0x18);
          QList<QStandardItem_*>::QList((QList<QStandardItem_*> *)0x8d194e);
          QList<QStandardItem_*>::operator=
                    ((QList<QStandardItem_*> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          QList<QStandardItem_*>::~QList((QList<QStandardItem_*> *)0x8d1971);
          QStandardItemModelPrivate::columnsRemoved(this_00,parent,row_00,in_stack_ffffffffffffff40)
          ;
        }
        *(int *)&in_stack_ffffffffffffff38->field_0x40 = in_stack_ffffffffffffff2c;
        *(int *)&in_stack_ffffffffffffff38->field_0x44 = in_stack_ffffffffffffff28;
        QList<QStandardItem_*>::operator=
                  ((QList<QStandardItem_*> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        QStandardItemModel::indexFromItem
                  ((QStandardItemModel *)CONCAT44(row_00,in_stack_ffffffffffffff40),
                   (QStandardItem *)in_stack_ffffffffffffff38);
        local_20 = local_80;
        local_18 = local_78;
        local_10 = local_70;
        QList<QStandardItem_*>::~QList((QList<QStandardItem_*> *)0x8d19ff);
      }
      QStandardItemPrivate::setParentAndModel
                ((QStandardItemPrivate *)in_stack_ffffffffffffff30,
                 (QStandardItem *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (QStandardItemModel *)in_stack_ffffffffffffff20);
    }
    QList<QStandardItem_*>::replace
              ((QList<QStandardItem_*> *)in_stack_ffffffffffffff38,
               (qsizetype)in_stack_ffffffffffffff30,
               (parameter_type)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff20);
    if (bVar1) {
      pQVar3 = *(QModelIndex **)this_00;
      memset(local_98,0,0x18);
      QList<int>::QList((QList<int> *)0x8d1a62);
      QAbstractItemModel::dataChanged(pQVar3,(QModelIndex *)&local_20,(QList_conflict3 *)&local_20);
      QList<int>::~QList((QList<int> *)0x8d1a86);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return parent;
}

Assistant:

QStandardItem *QStandardItem::takeChild(int row, int column)
{
    Q_D(QStandardItem);
    QStandardItem *item = nullptr;
    int index = d->childIndex(row, column);
    if (index != -1) {
        QModelIndex changedIdx;
        item = d->children.at(index);
        if (item) {
            QStandardItemPrivate *const item_d = item->d_func();
            if (d->model) {
                QStandardItemModelPrivate *const model_d = d->model->d_func();
                const int savedRows = item_d->rows;
                const int savedCols = item_d->columns;
                const QVector<QStandardItem*> savedChildren = item_d->children;
                if (savedRows > 0) {
                    model_d->rowsAboutToBeRemoved(item, 0, savedRows - 1);
                    item_d->rows = 0;
                    item_d->children = QVector<QStandardItem*>(); //slightly faster than clear
                    model_d->rowsRemoved(item, 0, savedRows);
                }
                if (savedCols > 0) {
                    model_d->columnsAboutToBeRemoved(item, 0, savedCols - 1);
                    item_d->columns = 0;
                    item_d->children = QVector<QStandardItem*>(); //slightly faster than clear
                    model_d->columnsRemoved(item, 0, savedCols);
                }
                item_d->rows = savedRows;
                item_d->columns = savedCols;
                item_d->children = savedChildren;
                changedIdx = d->model->indexFromItem(item);
            }
            item_d->setParentAndModel(nullptr, nullptr);
        }
        d->children.replace(index, nullptr);
        if (changedIdx.isValid())
            d->model->dataChanged(changedIdx, changedIdx);
    }
    return item;
}